

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O0

enable_if_t<IsFabArray<MultiFab>::value>
amrex::
FillPatchTwoLevels<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
          (MultiFab *mf,Real time,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *cmf
          ,Vector<double,_std::allocator<double>_> *ct,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *fmf,
          Vector<double,_std::allocator<double>_> *ft,int scomp,int dcomp,int ncomp,Geometry *cgeom,
          Geometry *fgeom,StateDataPhysBCFunct *cbc,int cbccomp,StateDataPhysBCFunct *fbc,
          int fbccomp,IntVect *ratio,InterpBase *mapper,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcscomp,
          NullInterpHook<amrex::FArrayBox> *pre_interp,NullInterpHook<amrex::FArrayBox> *post_interp
          )

{
  FabArrayBase *in_RDI;
  IndexSpace *index_space;
  Vector<double,_std::allocator<double>_> *in_stack_00001610;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_00001618;
  Vector<double,_std::allocator<double>_> *in_stack_00001620;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_00001628;
  Real in_stack_00001630;
  IntVect *in_stack_00001638;
  MultiFab *in_stack_00001640;
  int in_stack_000017f0;
  int in_stack_000017f8;
  int in_stack_00001800;
  Geometry *in_stack_00001808;
  Geometry *in_stack_00001810;
  StateDataPhysBCFunct *in_stack_00001818;
  int in_stack_00001820;
  StateDataPhysBCFunct *in_stack_00001828;
  int in_stack_00001830;
  IntVect *in_stack_00001838;
  InterpBase *in_stack_00001840;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00001848;
  int in_stack_00001850;
  NullInterpHook<amrex::FArrayBox> *in_stack_00001858;
  NullInterpHook<amrex::FArrayBox> *in_stack_00001860;
  IndexSpace *in_stack_00001868;
  
  EB2::TopIndexSpaceIfPresent();
  FabArrayBase::nGrowVect(in_RDI);
  (anonymous_namespace)::
  FillPatchTwoLevels_doit<amrex::MultiFab,amrex::StateDataPhysBCFunct,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
            (in_stack_00001640,in_stack_00001638,in_stack_00001630,in_stack_00001628,
             in_stack_00001620,in_stack_00001618,in_stack_00001610,in_stack_000017f0,
             in_stack_000017f8,in_stack_00001800,in_stack_00001808,in_stack_00001810,
             in_stack_00001818,in_stack_00001820,in_stack_00001828,in_stack_00001830,
             in_stack_00001838,in_stack_00001840,in_stack_00001848,in_stack_00001850,
             in_stack_00001858,in_stack_00001860,in_stack_00001868);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
FillPatchTwoLevels (MF& mf, Real time,
                    const Vector<MF*>& cmf, const Vector<Real>& ct,
                    const Vector<MF*>& fmf, const Vector<Real>& ft,
                    int scomp, int dcomp, int ncomp,
                    const Geometry& cgeom, const Geometry& fgeom,
                    BC& cbc, int cbccomp,
                    BC& fbc, int fbccomp,
                    const IntVect& ratio,
                    Interp* mapper,
                    const Vector<BCRec>& bcs, int bcscomp,
                    const PreInterpHook& pre_interp,
                    const PostInterpHook& post_interp)
{
#ifdef AMREX_USE_EB
    EB2::IndexSpace const* index_space = EB2::TopIndexSpaceIfPresent();
#else
    EB2::IndexSpace const* index_space = nullptr;
#endif

    FillPatchTwoLevels_doit(mf,mf.nGrowVect(),time,cmf,ct,fmf,ft,
                            scomp,dcomp,ncomp,cgeom,fgeom,
                            cbc,cbccomp,fbc,fbccomp,ratio,mapper,bcs,bcscomp,
                            pre_interp,post_interp,index_space);
}